

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinskiplus.h
# Opt level: O0

bool ClownLZSS::Internal::KosinskiPlus::Compress<std::ofstream>
               (uchar *data,size_t data_size,
               CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  type pCVar5;
  ulong uVar6;
  int local_88;
  size_t length;
  size_t distance;
  ClownLZSS_Match *match;
  DescriptorFieldWriter<decltype(output)> descriptor_bits;
  size_t local_38;
  size_t total_matches;
  Matches matches;
  CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output_local;
  size_t data_size_local;
  uchar *data_local;
  
  matches._M_t.super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
  super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
  super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl =
       (__uniq_ptr_data<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter,_true,_true>)
       (__uniq_ptr_data<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter,_true,_true>)output;
  std::unique_ptr<ClownLZSS_Match[],ClownLZSS::Internal::MatchDeleter>::
  unique_ptr<ClownLZSS::Internal::MatchDeleter,void>
            ((unique_ptr<ClownLZSS_Match[],ClownLZSS::Internal::MatchDeleter> *)&total_matches);
  bVar4 = FindOptimalMatches(-1,0x108,0x2000,
                             (_func_void_uchar_ptr_size_t_size_t_ClownLZSS_GraphEdge_ptr_void_ptr *)
                             0x0,9,GetMatchCost,data,1,data_size,(Matches *)&total_matches,&local_38
                             ,(void *)0x0);
  if (bVar4) {
    BitField::
    DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
    ::DescriptorFieldWriter
              ((DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
                *)&match,
               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *)
               matches._M_t.
               super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
               super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
               super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl);
    for (distance = (size_t)std::unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>::
                            operator[]((unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>
                                        *)&total_matches,0);
        pCVar5 = std::unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>::operator[]
                           ((unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter> *)
                            &total_matches,local_38), (type)distance != pCVar5;
        distance = distance + 0x18) {
      if (*(long *)distance == *(long *)(distance + 8) + 1) {
        BitField::
        WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
        ::Push((WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                *)&match,true);
        OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
        ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)matches._M_t.
                   super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
                   super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                   super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,
                data[*(long *)(distance + 8)]);
      }
      else {
        uVar6 = *(long *)(distance + 8) - *(long *)distance;
        uVar1 = *(ulong *)(distance + 0x10);
        length._0_4_ = (int)uVar6;
        local_88 = (int)uVar1;
        cVar2 = (char)uVar6;
        cVar3 = (char)uVar1;
        if (((uVar1 < 2) || (5 < uVar1)) || (0x100 < uVar6)) {
          if ((uVar1 < 3) || (9 < uVar1)) {
            BitField::
            WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            ::Push((WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                    *)&match,false);
            BitField::
            WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            ::Push((WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                    *)&match,true);
            OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
            ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                     *)matches._M_t.
                       super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>.
                       _M_t.
                       super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                       super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,
                    (byte)((uint)-(int)length >> 5) & 0xf8);
            OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
            ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                     *)matches._M_t.
                       super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>.
                       _M_t.
                       super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                       super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,-cVar2);
            OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
            ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                     *)matches._M_t.
                       super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>.
                       _M_t.
                       super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                       super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,cVar3 + 0xf7);
          }
          else {
            BitField::
            WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            ::Push((WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                    *)&match,false);
            BitField::
            WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            ::Push((WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                    *)&match,true);
            OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
            ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                     *)matches._M_t.
                       super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>.
                       _M_t.
                       super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                       super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,
                    (byte)((uint)-(int)length >> 5) & 0xf8 | 10U - cVar3 & 7);
            OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
            ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                     *)matches._M_t.
                       super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>.
                       _M_t.
                       super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                       super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,-cVar2);
          }
        }
        else {
          BitField::
          WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
          ::Push((WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                  *)&match,false);
          BitField::
          WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
          ::Push((WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                  *)&match,false);
          OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
          ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                   *)matches._M_t.
                     super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
                     super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                     super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,-cVar2);
          BitField::
          WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
          ::Push((WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                  *)&match,SUB41((local_88 - 2U & 2) >> 1,0));
          BitField::
          WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
          ::Push((WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                  *)&match,(bool)(cVar3 - 2U & 1));
        }
      }
    }
    BitField::
    WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
    ::Push((WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            *)&match,false);
    BitField::
    WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
    ::Push((WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
            *)&match,true);
    OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             *)matches._M_t.
               super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
               super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
               super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,0xf0);
    OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             *)matches._M_t.
               super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
               super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
               super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,'\0');
    OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
             *)matches._M_t.
               super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
               super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
               super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,'\0');
    data_local._7_1_ = true;
    descriptor_bits.descriptor_position._M_state.__count = 1;
    BitField::
    DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
    ::~DescriptorFieldWriter
              ((DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)0,_(ClownLZSS::Internal::Endian)0,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
                *)&match);
  }
  else {
    data_local._7_1_ = false;
    descriptor_bits.descriptor_position._M_state.__count = 1;
  }
  std::unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>::~unique_ptr
            ((unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter> *)&total_matches);
  return data_local._7_1_;
}

Assistant:

bool Compress(const unsigned char* const data, const std::size_t data_size, CompressorOutput<T> &output)
			{
				// Produce a series of LZSS compression matches.
				ClownLZSS::Matches matches;
				std::size_t total_matches;
				if (!ClownLZSS::FindOptimalMatches(-1, 0x100 + 8, 0x2000, nullptr, 1 + 8, GetMatchCost, data, 1, data_size, &matches, &total_matches, nullptr))
					return false;

				DescriptorFieldWriter<decltype(output)> descriptor_bits(output);

				// Produce Kosinski+-formatted data.
				for (ClownLZSS_Match *match = &matches[0]; match != &matches[total_matches]; ++match)
				{
					if (CLOWNLZSS_MATCH_IS_LITERAL(match))
					{
						descriptor_bits.Push(1);
						output.Write(data[match->destination]);
					}
					else
					{
						const std::size_t distance = match->destination - match->source;
						const std::size_t length = match->length;

						if (length >= 2 && length <= 5 && distance <= 0x100)
						{
							descriptor_bits.Push(0);
							descriptor_bits.Push(0);
							output.Write(-distance & 0xFF);
							descriptor_bits.Push(!!((length - 2) & 2));
							descriptor_bits.Push(!!((length - 2) & 1));
						}
						else if (length >= 3 && length <= 9)
						{
							descriptor_bits.Push(0);
							descriptor_bits.Push(1);
							output.Write(((-distance >> (8 - 3)) & 0xF8) | ((10 - length) & 7));
							output.Write(-distance & 0xFF);
						}
						else //if (length >= 10)
						{
							descriptor_bits.Push(0);
							descriptor_bits.Push(1);
							output.Write((-distance >> (8 - 3)) & 0xF8);
							output.Write(-distance & 0xFF);
							output.Write(length - 9);
						}
					}
				}

				// Add the terminator match.
				descriptor_bits.Push(0);
				descriptor_bits.Push(1);
				output.Write(0xF0);
				output.Write(0x00);
				output.Write(0x00);

				return true;
			}